

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert(fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,unsigned_long *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  bool bVar1;
  _Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>
  *p_Var2;
  __off64_t *in_R8;
  size_t in_R9;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>,_bool>
  pVar3;
  uint in_stack_ffffffffffffff58;
  unordered_map<unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>_>
  *this_00;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
  local_78;
  undefined1 local_70;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
  local_68;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
  local_60;
  reference local_58;
  element *e;
  _List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  local_48;
  fifo_iterator last_element_position;
  _List_const_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  local_38;
  iterator local_30;
  _List_const_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  unsigned_long *key_local;
  fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  local_20 = value;
  value_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key;
  key_local = (unsigned_long *)this;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
       ::end(&this->m_fifo_list);
  std::
  _List_const_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::_List_const_iterator(&local_28,&local_30);
  last_element_position._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
       ::begin(&this->m_fifo_list);
  std::
  _List_const_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  ::_List_const_iterator(&local_38,&last_element_position);
  std::__cxx11::
  list<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::splice(&this->m_fifo_list,(int)local_28._M_node,(__off64_t *)&this->m_fifo_list,
           (int)local_38._M_node,in_R8,in_R9,in_stack_ffffffffffffff58);
  e = (element *)
      std::__cxx11::
      list<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
      ::end(&this->m_fifo_list);
  local_48 = std::
             prev<std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>
                       ((_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
                         )e,1);
  local_58 = std::
             _List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
             ::operator*(&local_48);
  bVar1 = std::
          optional<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>_>
          ::has_value(&local_58->m_keyed_position);
  if (bVar1) {
    this_00 = &this->m_keyed_elements;
    p_Var2 = std::
             optional<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>_>
             ::value(&local_58->m_keyed_position);
    local_60._M_cur =
         (p_Var2->
         super__Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
         )._M_cur;
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>_>
         ::erase(this_00,local_60._M_cur);
  }
  else {
    this->m_used_size = this->m_used_size + 1;
  }
  std::__cxx11::string::operator=((string *)&local_58->m_value,(string *)local_20);
  pVar3 = std::
          unordered_map<unsigned_long,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
          ::
          emplace<unsigned_long_const&,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>&>
                    ((unordered_map<unsigned_long,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
                      *)&this->m_keyed_elements,(unsigned_long *)value_local,&local_48);
  local_78._M_cur =
       (__node_type *)
       pVar3.first.
       super__Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
       ._M_cur;
  local_70 = pVar3.second;
  std::
  optional<std::__detail::_Node_iterator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,false,false>>
  ::operator=((optional<std::__detail::_Node_iterator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,false,false>>
               *)local_58,
              (_Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>
               *)&local_78);
  return;
}

Assistant:

auto do_insert(const key_type& key, value_type&& value) -> void
    {
        // Take the head item and replace it at the tail of the fifo list.
        m_fifo_list.splice(m_fifo_list.end(), m_fifo_list, m_fifo_list.begin());

        fifo_iterator last_element_position = std::prev(m_fifo_list.end());
        element&      e                     = *last_element_position;

        // since we 'deleted' the head item, if it has a value in the keyed data
        // structure it needs to be deleted first.
        if (e.m_keyed_position.has_value())
        {
            m_keyed_elements.erase(e.m_keyed_position.value());
        }
        else
        {
            // If the cache isn't 'full' increment its size.
            ++m_used_size;
        }

        e.m_value          = std::move(value);
        e.m_keyed_position = m_keyed_elements.emplace(key, last_element_position).first;
    }